

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall
Parser::ParseDestructuredLiteralWithScopeSave
          (Parser *this,tokens declarationType,bool isDecl,bool topLevel,
          DestructuringInitializerContext initializerContext,bool allowIn)

{
  ParseNodeFnc *pPVar1;
  ParseNodeFnc *pPVar2;
  uint *puVar3;
  uint uVar4;
  charcount_t cVar5;
  ParseNodePtr local_60;
  ParseNodePtr newTempScope;
  ParseNodePtr *ppPStack_50;
  int32 local_40 [2];
  int32 newTempAstSize;
  uint newTempNestedCount;
  
  pPVar1 = this->m_currentNodeFunc;
  pPVar2 = this->m_currentNodeDeferredFunc;
  if (pPVar2 == (ParseNodeFnc *)0x0) {
    this->m_currentNodeDeferredFunc = pPVar1;
  }
  _newTempAstSize = this->m_pCurrentAstSize;
  puVar3 = this->m_pnestedCount;
  newTempScope = (ParseNodePtr)this->m_ppnodeScope;
  ppPStack_50 = this->m_ppnodeExprScope;
  local_60 = (ParseNodePtr)0x0;
  this->m_ppnodeScope = &local_60;
  local_40[0] = 0;
  this->m_pCurrentAstSize = local_40;
  local_40[1] = 0;
  this->m_pnestedCount = (uint *)(local_40 + 1);
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  uVar4 = this->m_funcInArrayDepth;
  cVar5 = this->m_funcInArray;
  this->m_hasDeferredShorthandInitError = false;
  ParseDestructuredLiteral<false>
            (this,declarationType,isDecl,topLevel,initializerContext,allowIn,(BOOL *)0x0,(BOOL *)0x0
            );
  this->m_currentNodeFunc = pPVar1;
  this->m_currentNodeDeferredFunc = pPVar2;
  this->m_pCurrentAstSize = _newTempAstSize;
  this->m_pnestedCount = puVar3;
  this->m_ppnodeScope = (ParseNodePtr *)newTempScope;
  this->m_ppnodeExprScope = ppPStack_50;
  this->m_funcInArrayDepth = uVar4;
  this->m_funcInArray = cVar5;
  return;
}

Assistant:

void Parser::ParseDestructuredLiteralWithScopeSave(tokens declarationType,
    bool isDecl,
    bool topLevel,
    DestructuringInitializerContext initializerContext/* = DIC_None*/,
    bool allowIn /*= true*/)
{
    // We are going to parse the text again to validate the current grammar as Destructuring. Saving some scopes and
    // AST related information before the validation parsing and later they will be restored.

    ParseNodeFnc * pnodeFncSave = m_currentNodeFunc;
    ParseNodeFnc * pnodeDeferredFncSave = m_currentNodeDeferredFunc;
    if (m_currentNodeDeferredFunc == nullptr)
    {
        m_currentNodeDeferredFunc = m_currentNodeFunc;
    }
    int32 *pAstSizeSave = m_pCurrentAstSize;
    uint *pNestedCountSave = m_pnestedCount;
    ParseNodePtr *ppnodeScopeSave = m_ppnodeScope;
    ParseNodePtr *ppnodeExprScopeSave = m_ppnodeExprScope;

    ParseNodePtr newTempScope = nullptr;
    m_ppnodeScope = &newTempScope;

    int32 newTempAstSize = 0;
    m_pCurrentAstSize = &newTempAstSize;

    uint newTempNestedCount = 0;
    m_pnestedCount = &newTempNestedCount;

    m_ppnodeExprScope = nullptr;

    charcount_t funcInArraySave = m_funcInArray;
    uint funcInArrayDepthSave = m_funcInArrayDepth;

    // we need to reset this as we are going to parse the grammar again.
    m_hasDeferredShorthandInitError = false;

    ParseDestructuredLiteral<false>(declarationType, isDecl, topLevel, initializerContext, allowIn);

    m_currentNodeFunc = pnodeFncSave;
    m_currentNodeDeferredFunc = pnodeDeferredFncSave;
    m_pCurrentAstSize = pAstSizeSave;
    m_pnestedCount = pNestedCountSave;
    m_ppnodeScope = ppnodeScopeSave;
    m_ppnodeExprScope = ppnodeExprScopeSave;
    m_funcInArray = funcInArraySave;
    m_funcInArrayDepth = funcInArrayDepthSave;
}